

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# neverbleed.c
# Opt level: O0

int priv_encdec_stub(char *name,_func_int_int_uchar_ptr_uchar_ptr_RSA_ptr_int *func,expbuf_t *buf)

{
  int iVar1;
  uchar *puVar2;
  int *piVar3;
  RSA *r;
  int local_1074;
  int ret;
  RSA *rsa;
  size_t padding;
  size_t key_index;
  size_t flen;
  uchar to [4096];
  uchar *from;
  expbuf_t *buf_local;
  _func_int_int_uchar_ptr_uchar_ptr_RSA_ptr_int *func_local;
  char *name_local;
  
  puVar2 = (uchar *)expbuf_shift_bytes(buf,&key_index);
  if (((puVar2 == (uchar *)0x0) || (iVar1 = expbuf_shift_num(buf,&padding), iVar1 != 0)) ||
     (iVar1 = expbuf_shift_num(buf,(size_t *)&rsa), iVar1 != 0)) {
    piVar3 = __errno_location();
    *piVar3 = 0;
    warnf("%s: failed to parse request",name);
    name_local._4_4_ = -1;
  }
  else {
    r = (RSA *)daemon_get_rsa(padding);
    if (r == (RSA *)0x0) {
      piVar3 = __errno_location();
      *piVar3 = 0;
      warnf("%s: invalid key index:%zu\n",name,padding);
      name_local._4_4_ = -1;
    }
    else {
      local_1074 = (*func)((int)key_index,puVar2,(uchar *)&flen,(RSA *)r,(int)rsa);
      expbuf_dispose(buf);
      RSA_free(r);
      expbuf_push_num(buf,(long)local_1074);
      if (local_1074 < 1) {
        local_1074 = 0;
      }
      expbuf_push_bytes(buf,&flen,(long)local_1074);
      name_local._4_4_ = 0;
    }
  }
  return name_local._4_4_;
}

Assistant:

static int priv_encdec_stub(const char *name,
                            int (*func)(int flen, const unsigned char *from, unsigned char *to, RSA *rsa, int padding),
                            struct expbuf_t *buf)
{
    unsigned char *from, to[4096];
    size_t flen;
    size_t key_index, padding;
    RSA *rsa;
    int ret;

    if ((from = expbuf_shift_bytes(buf, &flen)) == NULL || expbuf_shift_num(buf, &key_index) != 0 ||
        expbuf_shift_num(buf, &padding) != 0) {
        errno = 0;
        warnf("%s: failed to parse request", name);
        return -1;
    }
    if ((rsa = daemon_get_rsa(key_index)) == NULL) {
        errno = 0;
        warnf("%s: invalid key index:%zu\n", name, key_index);
        return -1;
    }
    ret = func((int)flen, from, to, rsa, (int)padding);
    expbuf_dispose(buf);
    RSA_free(rsa);

    expbuf_push_num(buf, ret);
    expbuf_push_bytes(buf, to, ret > 0 ? ret : 0);

    return 0;
}